

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],unsigned_long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [39],unsigned_long_long *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  unsigned_long_long *params_00;
  long lVar4;
  String argValues [2];
  String *pSVar5;
  undefined8 uVar6;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[39]>(&local_68,(kj *)params,(char (*) [39])CONCAT44(in_register_00000014,line));
  str<unsigned_long_long&>(&local_50,(kj *)params_1,params_00);
  pSVar5 = &local_68;
  uVar6 = 2;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_68.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_68.content.size_ + lVar4);
      *(undefined8 *)((long)&local_68.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_68.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_68.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}